

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::CheckALLOW_DUPLICATE_CUSTOM_TARGETS(cmGlobalGenerator *this)

{
  cmState *this_00;
  bool bVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  this_00 = this->CMakeInstance->State;
  local_190._0_8_ = local_190 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"ALLOW_DUPLICATE_CUSTOM_TARGETS","");
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,(string *)local_190);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"This project has enabled the ALLOW_DUPLICATE_CUSTOM_TARGETS ",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"global property.  ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"The \"",5);
    (*this->_vptr_cmGlobalGenerator[3])(&local_1b0,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" generator does not support ",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"duplicate custom targets.  ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Consider using a Makefiles generator or fix the project to not ",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"use duplicate target names.",0x1b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
  return !bVar1;
}

Assistant:

bool cmGlobalGenerator::CheckALLOW_DUPLICATE_CUSTOM_TARGETS() const
{
  // If the property is not enabled then okay.
  if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
        "ALLOW_DUPLICATE_CUSTOM_TARGETS")) {
    return true;
  }

  // This generator does not support duplicate custom targets.
  std::ostringstream e;
  e << "This project has enabled the ALLOW_DUPLICATE_CUSTOM_TARGETS "
    << "global property.  "
    << "The \"" << this->GetName() << "\" generator does not support "
    << "duplicate custom targets.  "
    << "Consider using a Makefiles generator or fix the project to not "
    << "use duplicate target names.";
  cmSystemTools::Error(e.str());
  return false;
}